

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O3

void __thiscall despot::ParticleBelief::Update(ParticleBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  History *this_00;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_01;
  State *pSVar1;
  DSPOMDP *pDVar2;
  Belief *belief;
  double dVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  log_ostream *plVar8;
  ostream *poVar9;
  pointer ppSVar10;
  undefined4 extraout_var;
  long lVar11;
  long lVar12;
  pointer ppSVar13;
  ulong uVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar15;
  State *particle;
  vector<despot::State_*,_std::allocator<despot::State_*>_> updated;
  OBS_TYPE o;
  double reward;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_118;
  double local_f8;
  uint local_ec;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_e8;
  History *local_c8;
  OBS_TYPE local_c0;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_b8;
  History local_a0;
  History local_70;
  undefined1 local_38 [8];
  
  this_00 = &(this->super_Belief).history_;
  local_ec = action;
  local_c0 = obs;
  History::Add(this_00,action,obs);
  uVar4 = local_ec;
  local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (State **)0x0;
  local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (State **)0x0;
  ppSVar10 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c8 = this_00;
  if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppSVar10) {
    local_f8 = 0.0;
  }
  else {
    uVar14 = 0;
    local_f8 = 0.0;
    do {
      pSVar1 = ppSVar10[uVar14];
      pDVar2 = (this->super_Belief).model_;
      local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pSVar1;
      dVar3 = Random::NextDouble((Random *)&Random::RANDOM);
      iVar6 = (*pDVar2->_vptr_DSPOMDP[2])(SUB84(dVar3,0),pDVar2,pSVar1,(ulong)uVar4,local_38);
      pDVar2 = (this->super_Belief).model_;
      (*pDVar2->_vptr_DSPOMDP[7])
                (pDVar2,local_c0,
                 local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,(ulong)uVar4);
      if ((char)iVar6 == '\0' && (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.0) {
        dVar3 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) *
                *(double *)
                 ((long)local_118.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x18);
        *(double *)
         ((long)local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_start + 0x18) = dVar3;
        local_f8 = local_f8 + dVar3;
        if (local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<despot::State*,std::allocator<despot::State*>>::
          _M_realloc_insert<despot::State*const&>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(State **)&local_118);
        }
        else {
          *local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (State *)local_118.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        pDVar2 = (this->super_Belief).model_;
        (*pDVar2->_vptr_DSPOMDP[0x17])
                  (pDVar2,local_118.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      }
      uVar14 = uVar14 + 1;
      ppSVar10 = (this->particles_).
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(this->particles_).
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar10 >> 3
                             ));
  }
  iVar6 = logging::level();
  if ((0 < iVar6) && (iVar6 = logging::level(), 3 < iVar6)) {
    plVar8 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar8->super_ostream,"[ParticleBelief::Update] ",0x19);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)plVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," particles survived among ",0x1a);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  this_01 = &this->particles_;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=(this_01,&local_e8);
  ppSVar10 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppSVar13 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if ((long)ppSVar13 - (long)ppSVar10 != 0) {
    lVar11 = (long)ppSVar13 - (long)ppSVar10 >> 3;
    goto LAB_0013aa0e;
  }
  iVar6 = logging::level();
  if ((0 < iVar6) && (iVar6 = logging::level(), 1 < iVar6)) {
    plVar8 = logging::stream(2);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar8->super_ostream,"Particle set is empty!",0x16);
    std::ios::widen((char)(plVar8->super_ostream)._vptr_basic_ostream[-3] + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
  }
  if (this->prior_ == (Belief *)0x0) {
    iVar6 = logging::level();
    if ((0 < iVar6) && (iVar6 = logging::level(), 1 < iVar6)) {
      plVar8 = logging::stream(2);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar8->super_ostream,
                 "Resampling by searching initial particles which are consistent with history",0x4b)
      ;
      std::ios::widen((char)(plVar8->super_ostream)._vptr_basic_ostream[-3] + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
    }
    iVar6 = this->num_particles_;
    pDVar2 = (this->super_Belief).model_;
    std::vector<int,_std::allocator<int>_>::vector(&local_a0.actions_,&local_c8->actions_);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_a0.observations_,&(this->super_Belief).history_.observations_);
    Resample(&local_118,iVar6,&this->initial_particles_,pDVar2,&local_a0,0);
    ppSVar10 = (this->particles_).
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppSVar13 = (this->particles_).
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
    .super__Vector_impl_data._M_start =
         local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppSVar10 != (pointer)0x0) {
      ppSVar13 = (pointer)((long)ppSVar13 - (long)ppSVar10);
      operator_delete(ppSVar10,(ulong)ppSVar13);
      if ((State *)local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
        ppSVar13 = (pointer)((long)local_118.
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.
                                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_118.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,(ulong)ppSVar13);
      }
    }
    iVar6 = (int)ppSVar13;
    if (local_a0.observations_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar14 = (long)local_a0.observations_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
               (long)local_a0.observations_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      operator_delete(local_a0.observations_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar14);
      iVar6 = (int)uVar14;
    }
  }
  else {
    iVar6 = logging::level();
    if ((0 < iVar6) && (iVar6 = logging::level(), 1 < iVar6)) {
      plVar8 = logging::stream(2);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar8->super_ostream,
                 "Resampling by drawing random particles from prior which are consistent with history"
                 ,0x53);
      std::ios::widen((char)(plVar8->super_ostream)._vptr_basic_ostream[-3] + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
    }
    iVar6 = this->num_particles_;
    belief = this->prior_;
    std::vector<int,_std::allocator<int>_>::vector(&local_70.actions_,&local_c8->actions_);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_70.observations_,&(this->super_Belief).history_.observations_);
    Resample(&local_118,iVar6,belief,&local_70,0);
    ppSVar10 = (this->particles_).
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppSVar13 = (this->particles_).
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
    .super__Vector_impl_data._M_start =
         local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppSVar10 != (pointer)0x0) {
      ppSVar13 = (pointer)((long)ppSVar13 - (long)ppSVar10);
      operator_delete(ppSVar10,(ulong)ppSVar13);
      if ((State *)local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
        ppSVar13 = (pointer)((long)local_118.
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.
                                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_118.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,(ulong)ppSVar13);
      }
    }
    iVar6 = (int)ppSVar13;
    local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_70.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_70.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    if (local_70.observations_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar14 = (long)local_70.observations_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
               (long)local_70.observations_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      operator_delete(local_70.observations_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar14);
      iVar6 = (int)uVar14;
      local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_70.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_70.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    }
  }
  if (local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    uVar14 = (long)local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    operator_delete(local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,uVar14);
    iVar6 = (int)uVar14;
  }
  ppSVar10 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppSVar13 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppSVar13 == ppSVar10) {
    if (this->state_indexer_ != (StateIndexer *)0x0) {
      iVar7 = logging::level();
      if ((0 < iVar7) && (iVar7 = logging::level(), 1 < iVar7)) {
        plVar8 = logging::stream(2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar8->super_ostream,
                   "Resampling by searching states consistent with last (action, observation) pair",
                   0x4e);
        cVar5 = std::ios::widen((char)(plVar8->super_ostream)._vptr_basic_ostream[-3] + (char)plVar8
                               );
        iVar6 = (int)cVar5;
        std::ostream::put((char)plVar8);
        std::ostream::flush();
      }
      Resample(&local_118,iVar6,(this->super_Belief).model_,this->state_indexer_,local_ec,local_c0);
      ppSVar10 = (this->particles_).
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar13 = (this->particles_).
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((ppSVar10 != (pointer)0x0) &&
         (operator_delete(ppSVar10,(long)ppSVar13 - (long)ppSVar10),
         (State *)local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (State *)0x0)) {
        operator_delete(local_118.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ppSVar10 = (this->particles_).
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar13 = (this->particles_).
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      goto LAB_0013a91a;
    }
LAB_0013a923:
    iVar6 = logging::level();
    if ((0 < iVar6) && (iVar6 = logging::level(), 1 < iVar6)) {
      plVar8 = logging::stream(2);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar8->super_ostream,"Resampling failed - Using initial particles",0x2b);
      std::ios::widen((char)(plVar8->super_ostream)._vptr_basic_ostream[-3] + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
    }
    ppSVar10 = (this->initial_particles_).
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->initial_particles_).
        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppSVar10) {
      uVar14 = 0;
      do {
        pDVar2 = (this->super_Belief).model_;
        iVar6 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,ppSVar10[uVar14]);
        local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar6);
        std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                  ((vector<despot::State*,std::allocator<despot::State*>> *)this_01,
                   (State **)&local_118);
        uVar14 = uVar14 + 1;
        ppSVar10 = (this->initial_particles_).
                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(this->initial_particles_).
                                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar10 >>
                               3));
    }
  }
  else {
LAB_0013a91a:
    if (ppSVar13 == ppSVar10) goto LAB_0013a923;
  }
  ppSVar10 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppSVar13 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar11 = (long)ppSVar13 - (long)ppSVar10 >> 3;
  if (ppSVar13 == ppSVar10) {
    local_f8 = 0.0;
  }
  else {
    local_f8 = 0.0;
    lVar12 = 0;
    do {
      local_f8 = local_f8 + ppSVar10[lVar12]->weight;
      lVar12 = lVar12 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
  }
LAB_0013aa0e:
  if (ppSVar13 == ppSVar10) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    lVar12 = 0;
    do {
      dVar15 = ppSVar10[lVar12]->weight / local_f8;
      ppSVar10[lVar12]->weight = dVar15;
      dVar3 = dVar3 + dVar15 * dVar15;
      lVar12 = lVar12 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
  }
  iVar6 = this->num_particles_;
  if (1.0 / dVar3 < (double)iVar6 * 0.5) {
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_b8,this_01);
    Sample(&local_118,iVar6,&local_b8,(this->super_Belief).model_);
    if (local_b8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ppSVar10 = (this->particles_).
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppSVar10) {
      uVar14 = 0;
      do {
        pDVar2 = (this->super_Belief).model_;
        (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,ppSVar10[uVar14]);
        uVar14 = uVar14 + 1;
        ppSVar10 = (this->particles_).
                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(this->particles_).
                                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar10 >>
                               3));
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=(this_01,&local_118);
    if ((State *)local_118.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                 _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
      operator_delete(local_118.
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ParticleBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	history_.Add(action, obs);

	vector<State*> updated;
	double total_weight = 0;
	double reward;
	OBS_TYPE o;
	// Update particles
	for (int i = 0; i <particles_.size(); i++) {
		State* particle = particles_[i];
		bool terminal = model_->Step(*particle, Random::RANDOM.NextDouble(),
			action, reward, o);
		double prob = model_->ObsProb(obs, *particle, action);

		if (!terminal && prob) { // Terminal state is not required to be explicitly represented and may not have any observation
			particle->weight *= prob;
			total_weight += particle->weight;
			updated.push_back(particle);
		} else {
			model_->Free(particle);
		}
	}

	logd << "[ParticleBelief::Update] " << updated.size()
		<< " particles survived among " << particles_.size() << endl;
	particles_ = updated;

	// Resample if the particle set is empty
	if (particles_.size() == 0) {
		logw << "Particle set is empty!" << endl;
		if (prior_ != NULL) {
			logw
				<< "Resampling by drawing random particles from prior which are consistent with history"
				<< endl;
			particles_ = Resample(num_particles_, *prior_, history_);
		} else {
			logw
				<< "Resampling by searching initial particles which are consistent with history"
				<< endl;
			particles_ = Resample(num_particles_, initial_particles_, model_,
				history_);
		}

		if (particles_.size() == 0 && state_indexer_ != NULL) {
			logw
				<< "Resampling by searching states consistent with last (action, observation) pair"
				<< endl;
			particles_ = Resample(num_particles_, model_, state_indexer_,
				action, obs);
		}

		if (particles_.size() == 0) {
			logw << "Resampling failed - Using initial particles" << endl;
			for (int i = 0; i < initial_particles_.size(); i ++)
				particles_.push_back(model_->Copy(initial_particles_[i]));
		}

		//Update total weight so that effective number of particles are computed correctly
		total_weight = 0;
                for (int i = 0; i < particles_.size(); i++) {
		    State* particle = particles_[i];
                    total_weight = total_weight + particle->weight;
                }
	}


	double weight_square_sum = 0;
	for (int i = 0; i < particles_.size(); i++) {
		State* particle = particles_[i];
		particle->weight /= total_weight;
		weight_square_sum += particle->weight * particle->weight;
	}

	// Resample if the effective number of particles is "small"
	double num_effective_particles = 1.0 / weight_square_sum;
	if (num_effective_particles < num_particles_ / 2.0) {
		vector<State*> new_belief = Sample(num_particles_, particles_,
			model_);
		for (int i = 0; i < particles_.size(); i++)
			model_->Free(particles_[i]);

		particles_ = new_belief;
	}
}